

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O0

error_code __thiscall
simdjson::haswell::implementation::minify
          (implementation *this,uint8_t *buf,size_t len,uint8_t *dst,size_t *dst_len)

{
  error_code eVar1;
  size_t *in_stack_000007a0;
  uint8_t *in_stack_000007a8;
  size_t in_stack_000007b0;
  uint8_t *in_stack_000007b8;
  size_t *dst_len_local;
  uint8_t *dst_local;
  size_t len_local;
  uint8_t *buf_local;
  implementation *this_local;
  
  eVar1 = (anonymous_namespace)::stage1::json_minifier::minify<128ul>
                    (in_stack_000007b8,in_stack_000007b0,in_stack_000007a8,in_stack_000007a0);
  return eVar1;
}

Assistant:

simdjson_warn_unused error_code implementation::minify(const uint8_t *buf, size_t len, uint8_t *dst, size_t &dst_len) const noexcept {
  return haswell::stage1::json_minifier::minify<128>(buf, len, dst, dst_len);
}